

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement_type.cpp
# Opt level: O3

string * __thiscall
duckdb::StatementTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,StatementType type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)this) {
  case 1:
    pcVar2 = "SELECT";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "INSERT";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "UPDATE";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "CREATE";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "DELETE";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "PREPARE";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "EXECUTE";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "ALTER";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "TRANSACTION";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "COPY";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "ANALYZE";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "VARIABLE_SET";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "CREATE_FUNC";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "EXPLAIN";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "DROP";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "EXPORT";
    pcVar1 = "";
    break;
  case 0x11:
    pcVar2 = "PRAGMA";
    pcVar1 = "";
    break;
  case 0x12:
    pcVar2 = "VACUUM";
    pcVar1 = "";
    break;
  case 0x13:
    pcVar2 = "CALL";
    pcVar1 = "";
    break;
  case 0x14:
    pcVar2 = "SET";
    pcVar1 = "";
    break;
  case 0x15:
    pcVar2 = "LOAD";
    pcVar1 = "";
    break;
  case 0x16:
    pcVar2 = "RELATION";
    pcVar1 = "";
    break;
  case 0x17:
    pcVar2 = "EXTENSION";
    pcVar1 = "";
    break;
  case 0x18:
    pcVar2 = "LOGICAL_PLAN";
    pcVar1 = "";
    break;
  case 0x19:
    pcVar2 = "ATTACH";
    pcVar1 = "";
    break;
  case 0x1a:
    pcVar2 = "DETACH";
    pcVar1 = "";
    break;
  case 0x1b:
    pcVar2 = "MULTI";
    pcVar1 = "";
    break;
  case 0x1c:
    pcVar2 = "COPY_DATABASE";
    pcVar1 = "";
    break;
  case 0x1d:
    pcVar2 = "UPDATE_EXTENSIONS";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "INVALID";
    pcVar1 = "";
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string StatementTypeToString(StatementType type) {
	switch (type) {
	case StatementType::SELECT_STATEMENT:
		return "SELECT";
	case StatementType::INSERT_STATEMENT:
		return "INSERT";
	case StatementType::UPDATE_STATEMENT:
		return "UPDATE";
	case StatementType::DELETE_STATEMENT:
		return "DELETE";
	case StatementType::PREPARE_STATEMENT:
		return "PREPARE";
	case StatementType::EXECUTE_STATEMENT:
		return "EXECUTE";
	case StatementType::ALTER_STATEMENT:
		return "ALTER";
	case StatementType::TRANSACTION_STATEMENT:
		return "TRANSACTION";
	case StatementType::COPY_STATEMENT:
		return "COPY";
	case StatementType::COPY_DATABASE_STATEMENT:
		return "COPY_DATABASE";
	case StatementType::ANALYZE_STATEMENT:
		return "ANALYZE";
	case StatementType::VARIABLE_SET_STATEMENT:
		return "VARIABLE_SET";
	case StatementType::CREATE_FUNC_STATEMENT:
		return "CREATE_FUNC";
	case StatementType::EXPLAIN_STATEMENT:
		return "EXPLAIN";
	case StatementType::CREATE_STATEMENT:
		return "CREATE";
	case StatementType::DROP_STATEMENT:
		return "DROP";
	case StatementType::PRAGMA_STATEMENT:
		return "PRAGMA";
	case StatementType::VACUUM_STATEMENT:
		return "VACUUM";
	case StatementType::RELATION_STATEMENT:
		return "RELATION";
	case StatementType::EXPORT_STATEMENT:
		return "EXPORT";
	case StatementType::CALL_STATEMENT:
		return "CALL";
	case StatementType::SET_STATEMENT:
		return "SET";
	case StatementType::LOAD_STATEMENT:
		return "LOAD";
	case StatementType::EXTENSION_STATEMENT:
		return "EXTENSION";
	case StatementType::LOGICAL_PLAN_STATEMENT:
		return "LOGICAL_PLAN";
	case StatementType::ATTACH_STATEMENT:
		return "ATTACH";
	case StatementType::DETACH_STATEMENT:
		return "DETACH";
	case StatementType::MULTI_STATEMENT:
		return "MULTI";
	case StatementType::UPDATE_EXTENSIONS_STATEMENT:
		return "UPDATE_EXTENSIONS";
	case StatementType::INVALID_STATEMENT:
		break;
	}
	return "INVALID";
}